

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__build_fast_ac(stbi__int16 *fast_ac,stbi__huffman *h)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  uint uVar4;
  int local_34;
  int m;
  int k;
  int len;
  int magbits;
  int run;
  int rs;
  stbi_uc fast;
  int i;
  stbi__huffman *h_local;
  stbi__int16 *fast_ac_local;
  
  for (rs = 0; rs < 0x200; rs = rs + 1) {
    bVar1 = h->fast[rs];
    fast_ac[rs] = 0;
    if (bVar1 != 0xff) {
      bVar2 = h->values[bVar1];
      uVar4 = bVar2 & 0xf;
      bVar1 = h->size[bVar1];
      if (((bVar2 & 0xf) != 0) && (bVar1 + uVar4 < 10)) {
        sVar3 = (sbyte)uVar4;
        local_34 = (int)(rs << (bVar1 & 0x1f) & 0x1ffU) >> (9U - sVar3 & 0x1f);
        if (local_34 < 1 << (sVar3 - 1U & 0x1f)) {
          local_34 = (-1 << sVar3) + 1 + local_34;
        }
        if ((-0x81 < local_34) && (local_34 < 0x80)) {
          fast_ac[rs] = (short)(local_34 << 8) + (short)(((int)(uint)bVar2 >> 4) << 4) +
                        (ushort)bVar1 + (short)uVar4;
        }
      }
    }
  }
  return;
}

Assistant:

static void stbi__build_fast_ac(stbi__int16 *fast_ac, stbi__huffman *h)
{
   int i;
   for (i=0; i < (1 << FAST_BITS); ++i) {
      stbi_uc fast = h->fast[i];
      fast_ac[i] = 0;
      if (fast < 255) {
         int rs = h->values[fast];
         int run = (rs >> 4) & 15;
         int magbits = rs & 15;
         int len = h->size[fast];

         if (magbits && len + magbits <= FAST_BITS) {
            // magnitude code followed by receive_extend code
            int k = ((i << len) & ((1 << FAST_BITS) - 1)) >> (FAST_BITS - magbits);
            int m = 1 << (magbits - 1);
            if (k < m) k += (~0U << magbits) + 1;
            // if the result is small enough, we can fit it in fast_ac table
            if (k >= -128 && k <= 127)
               fast_ac[i] = (stbi__int16) ((k * 256) + (run * 16) + (len + magbits));
         }
      }
   }
}